

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

char * bc_file_get_contents(char *path,_Bool utf8,size_t *len,bc_error_t **err)

{
  _Bool _Var1;
  int iVar2;
  FILE *__stream;
  int *piVar3;
  char *pcVar4;
  bc_error_t *pbVar5;
  size_t sVar6;
  size_t skip;
  size_t read_len;
  char *tmp;
  char buffer [1024];
  bc_string_t *str;
  int tmp_errno;
  FILE *fp;
  bc_error_t **err_local;
  size_t *len_local;
  _Bool utf8_local;
  char *path_local;
  
  if ((((path == (char *)0x0) || (len == (size_t *)0x0)) || (err == (bc_error_t **)0x0)) ||
     (*err != (bc_error_t *)0x0)) {
    path_local = (char *)0x0;
  }
  else {
    *len = 0;
    __stream = fopen(path,"r");
    if (__stream == (FILE *)0x0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      pbVar5 = bc_error_new_printf(BC_ERROR_FILE,"Failed to open file (%s): %s",path,pcVar4);
      *err = pbVar5;
      path_local = (char *)0x0;
    }
    else {
      buffer._1016_8_ = bc_string_new();
      while (iVar2 = feof(__stream), iVar2 == 0) {
        skip = fread(&tmp,1,0x400,__stream);
        read_len = (size_t)&tmp;
        if (((utf8) && (*(long *)(buffer._1016_8_ + 8) == 0)) && (skip != 0)) {
          sVar6 = bc_utf8_skip_bom((uint8_t *)&tmp,skip);
          skip = skip - sVar6;
          read_len = sVar6 + read_len;
        }
        *len = skip + *len;
        bc_string_append_len((bc_string_t *)buffer._1016_8_,(char *)read_len,skip);
      }
      fclose(__stream);
      if ((utf8) && (_Var1 = bc_utf8_validate_str((bc_string_t *)buffer._1016_8_), !_Var1)) {
        pbVar5 = bc_error_new_printf(BC_ERROR_FILE,"File content is not valid UTF-8: %s",path);
        *err = pbVar5;
        bc_string_free((bc_string_t *)buffer._1016_8_,true);
        return (char *)0x0;
      }
      path_local = bc_string_free((bc_string_t *)buffer._1016_8_,false);
    }
  }
  return path_local;
}

Assistant:

char*
bc_file_get_contents(const char *path, bool utf8, size_t *len, bc_error_t **err)
{
    if (path == NULL || len == NULL || err == NULL || *err != NULL)
        return NULL;

    *len = 0;
    FILE *fp = fopen(path, "r");

    if (fp == NULL) {
        int tmp_errno = errno;
        *err = bc_error_new_printf(BC_ERROR_FILE,
            "Failed to open file (%s): %s", path, strerror(tmp_errno));
        return NULL;
    }

    bc_string_t *str = bc_string_new();
    char buffer[BC_FILE_CHUNK_SIZE];
    char *tmp;

    while (!feof(fp)) {
        size_t read_len = fread(buffer, sizeof(char), BC_FILE_CHUNK_SIZE, fp);

        tmp = buffer;

        if (utf8 && str->len == 0 && read_len > 0) {
            // skipping BOM before validation, for performance. should be safe
            // enough
            size_t skip = bc_utf8_skip_bom((uint8_t*) buffer, read_len);
            read_len -= skip;
            tmp += skip;
        }

        *len += read_len;
        bc_string_append_len(str, tmp, read_len);
    }
    fclose(fp);

    if (utf8 && !bc_utf8_validate_str(str)) {
        *err = bc_error_new_printf(BC_ERROR_FILE,
            "File content is not valid UTF-8: %s", path);
        bc_string_free(str, true);
        return NULL;
    }

    return bc_string_free(str, false);
}